

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_functions.cc
# Opt level: O2

float __thiscall
logloss::getUpdate(logloss *this,float prediction,float label,float update_scale,
                  float pred_per_update)

{
  float fVar1;
  
  fVar1 = expf(prediction * label);
  if (1e-06 <= update_scale * pred_per_update) {
    fVar1 = wexpmx(this,update_scale * pred_per_update + prediction * label + fVar1);
    fVar1 = -(label * fVar1 + prediction) / pred_per_update;
  }
  else {
    fVar1 = (label * update_scale) / (fVar1 + 1.0);
  }
  return fVar1;
}

Assistant:

float getUpdate(float prediction, float label, float update_scale, float pred_per_update)
  {
    float w, x;
    float d = correctedExp(label * prediction);
    if (update_scale * pred_per_update < 1e-6)
    {
      /* As with squared loss, for small eta_t we replace the update
       * with its first order Taylor expansion to avoid numerical problems
       */
      return label * update_scale / (1 + d);
    }
    x = update_scale * pred_per_update + label * prediction + d;
    w = wexpmx(x);
    return -(label * w + prediction) / pred_per_update;
  }